

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::StringStream<4096UL,_4096UL>::reset(StringStream<4096UL,_4096UL> *this)

{
  Buffer *pBVar1;
  Buffer *saved;
  Buffer *__end0;
  Buffer *__begin0;
  SmallVector<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer,_8UL> *__range2;
  StringStream<4096UL,_4096UL> *this_local;
  
  __end0 = VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>::begin
                     (&(this->saved_buffers).
                       super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>)
  ;
  pBVar1 = VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>::end
                     (&(this->saved_buffers).
                       super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>)
  ;
  for (; __end0 != pBVar1; __end0 = __end0 + 1) {
    if (__end0->buffer != this->stack_buffer) {
      free(__end0->buffer);
    }
  }
  if ((this->current_buffer).buffer != this->stack_buffer) {
    free((this->current_buffer).buffer);
  }
  SmallVector<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer,_8UL>::clear
            (&this->saved_buffers);
  (this->current_buffer).buffer = this->stack_buffer;
  (this->current_buffer).offset = 0;
  (this->current_buffer).size = 0x1000;
  return;
}

Assistant:

void reset()
	{
		for (auto &saved : saved_buffers)
			if (saved.buffer != stack_buffer)
				free(saved.buffer);
		if (current_buffer.buffer != stack_buffer)
			free(current_buffer.buffer);

		saved_buffers.clear();
		current_buffer.buffer = stack_buffer;
		current_buffer.offset = 0;
		current_buffer.size = sizeof(stack_buffer);
	}